

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O3

Path<lemon::SmartDigraph> * __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::negativeCycle(Path<lemon::SmartDigraph> *__return_storage_ptr__,
               BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
               *this)

{
  pointer pNVar1;
  PredMap *pPVar2;
  Digraph *pDVar3;
  iterator __position;
  Value *pVVar4;
  int id;
  uint uVar5;
  int iVar6;
  Arc *__args;
  int id_1;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  long lVar11;
  NodeMap<int> state;
  Value_conflict1 local_5c;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
  local_58;
  
  local_5c = -1;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>::
  VectorMap(&local_58,&this->_gr->super_ExtendedSmartDigraphBase,&local_5c);
  local_58.super_ObserverBase._vptr_ObserverBase = (_func_int **)&PTR__VectorMap_0016f5a8;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar1 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->_process).
                               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 2);
  if (0 < (int)uVar5) {
    pPVar2 = this->_pred;
    uVar8 = 0;
    do {
      iVar7 = pNVar1[uVar8]._id;
      lVar11 = (long)iVar7;
      if ((local_58.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11] == -1) &&
         (pVVar4 = (pPVar2->
                   super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                   ).
                   super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                   .super_Map.values, pVVar4[lVar11]._id != -1)) {
        __args = pVVar4 + lVar11;
        uVar9 = (ulong)(uint)local_58.container.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar11];
        if (uVar8 == uVar9) {
LAB_00156d2a:
          std::vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>::
          _M_realloc_insert<lemon::SmartDigraphBase::Arc_const&>
                    ((vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>
                      *)__return_storage_ptr__,(iterator)0x0,__args);
          pVVar4 = (this->_pred->
                   super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                   ).
                   super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                   .super_Map.values;
          for (iVar6 = (this->_gr->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                       super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                       ._M_impl.super__Vector_impl_data._M_start[pVVar4[lVar11]._id].source;
              iVar6 != iVar7;
              iVar6 = (this->_gr->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                      super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar6].source) {
            __position._M_current =
                 (__return_storage_ptr__->head).
                 super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->head).
                super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>
              ::_M_realloc_insert<lemon::SmartDigraphBase::Arc_const&>
                        ((vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>
                          *)__return_storage_ptr__,__position,pVVar4 + iVar6);
              pVVar4 = (this->_pred->
                       super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                       ).
                       super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                       .super_Map.values;
              iVar6 = pVVar4[iVar6]._id;
            }
            else {
              iVar6 = pVVar4[iVar6]._id;
              (__position._M_current)->_id = iVar6;
              (__return_storage_ptr__->head).
              super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
              ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          break;
        }
        pDVar3 = this->_gr;
        puVar10 = (uint *)(local_58.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar11);
        while ((int)uVar9 < 0) {
          *puVar10 = (uint)uVar8;
          iVar7 = (pDVar3->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                  super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                  ._M_impl.super__Vector_impl_data._M_start[__args->_id].source;
          lVar11 = (long)iVar7;
          if (pVVar4[lVar11]._id == -1) break;
          __args = pVVar4 + lVar11;
          puVar10 = (uint *)(local_58.container.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar11);
          uVar9 = (ulong)*puVar10;
          if (uVar8 == uVar9) goto LAB_00156d2a;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar5 & 0x7fffffff));
  }
  local_58.super_ObserverBase._vptr_ObserverBase = (_func_int **)&PTR__VectorMap_0016f658;
  if (local_58.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::~ObserverBase(&local_58.super_ObserverBase);
  return __return_storage_ptr__;
}

Assistant:

lemon::Path<Digraph> negativeCycle() const {
    typename Digraph::template NodeMap<int> state(*_gr, -1);
    lemon::Path<Digraph>                    cycle;
    for (int i = 0; i < int(_process.size()); ++i) {
      if (state[_process[i]] != -1)
        continue;
      for (Node v = _process[i]; (*_pred)[v] != INVALID;
           v      = _gr->source((*_pred)[v])) {
        if (state[v] == i) {
          cycle.addFront((*_pred)[v]);
          for (Node u = _gr->source((*_pred)[v]); u != v;
               u      = _gr->source((*_pred)[u])) {
            cycle.addFront((*_pred)[u]);
          }
          return cycle;
        } else if (state[v] >= 0) {
          break;
        }
        state[v] = i;
      }
    }
    return cycle;
  }